

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void cashew::ValueBuilder::appendCodeToSwitch(Ref switch_,Ref code,bool explicitBlock)

{
  uint uVar1;
  Ref *pRVar2;
  ulong uVar3;
  Value *pVVar4;
  size_t sVar5;
  undefined8 *puVar6;
  Ref local_50;
  Ref local_48;
  Value *local_40;
  Ref local_38;
  Ref local_30;
  ulong local_28;
  size_t i;
  Ref RStack_18;
  bool explicitBlock_local;
  Ref code_local;
  Ref switch__local;
  
  i._7_1_ = explicitBlock;
  RStack_18.inst = code.inst;
  code_local = switch_;
  pRVar2 = (Ref *)cashew::Ref::operator[]((uint)&code_local);
  uVar3 = cashew::Ref::operator==(pRVar2,(IString *)&SWITCH);
  if ((uVar3 & 1) == 0) {
    __assert_fail("switch_[0] == SWITCH",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x6f1,"static void cashew::ValueBuilder::appendCodeToSwitch(Ref, Ref, bool)");
  }
  pRVar2 = (Ref *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffe8);
  uVar3 = cashew::Ref::operator==(pRVar2,(IString *)&BLOCK);
  if ((uVar3 & 1) != 0) {
    if ((i._7_1_ & 1) == 0) {
      local_28 = 0;
      while( true ) {
        uVar3 = local_28;
        pRVar2 = (Ref *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffe8);
        pVVar4 = Ref::operator->(pRVar2);
        sVar5 = Value::size(pVVar4);
        if (sVar5 <= uVar3) break;
        pRVar2 = (Ref *)cashew::Ref::operator[]((uint)&code_local);
        pVVar4 = Ref::operator->(pRVar2);
        local_38 = Value::back(pVVar4);
        pVVar4 = Ref::operator->(&local_38);
        local_30 = Value::back(pVVar4);
        pVVar4 = Ref::operator->(&local_30);
        uVar1 = cashew::Ref::operator[]((uint)&stack0xffffffffffffffe8);
        puVar6 = (undefined8 *)cashew::Ref::operator[](uVar1);
        local_40 = (Value *)*puVar6;
        Value::push_back(pVVar4,(Ref)local_40);
        local_28 = local_28 + 1;
      }
    }
    else {
      pRVar2 = (Ref *)cashew::Ref::operator[]((uint)&code_local);
      pVVar4 = Ref::operator->(pRVar2);
      local_50 = Value::back(pVVar4);
      pVVar4 = Ref::operator->(&local_50);
      local_48 = Value::back(pVVar4);
      pVVar4 = Ref::operator->(&local_48);
      Value::push_back(pVVar4,RStack_18);
    }
    return;
  }
  __assert_fail("code[0] == BLOCK",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x6f2,"static void cashew::ValueBuilder::appendCodeToSwitch(Ref, Ref, bool)");
}

Assistant:

static void appendCodeToSwitch(Ref switch_, Ref code, bool explicitBlock) {
    assert(switch_[0] == SWITCH);
    assert(code[0] == BLOCK);
    if (!explicitBlock) {
      for (size_t i = 0; i < code[1]->size(); i++) {
        switch_[2]->back()->back()->push_back(code[1][i]);
      }
    } else {
      switch_[2]->back()->back()->push_back(code);
    }
  }